

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O2

Optional<Corrade::Containers::StridedArrayView<1U,_const_unsigned_int>_> * __thiscall
Corrade::Utility::Json::parseUnsignedIntArray
          (Optional<Corrade::Containers::StridedArrayView<1U,_const_unsigned_int>_>
           *__return_storage_ptr__,Json *this,JsonToken *token,size_t expectedSize)

{
  JsonToken *pJVar1;
  ulong uVar2;
  unsigned_long value;
  bool bVar3;
  State *pSVar4;
  Debug *pDVar5;
  ostream *output;
  long lVar6;
  BasicStringView<const_char> BVar7;
  Error err;
  
  pSVar4 = Containers::Pointer<Corrade::Utility::Json::State>::operator->(&this->_state);
  pJVar1 = (pSVar4->tokens)._data;
  lVar6 = 0x18;
  pSVar4 = Containers::Pointer<Corrade::Utility::Json::State>::operator->(&this->_state);
  if ((pSVar4->tokens)._size <= (ulong)(((long)token - (long)pJVar1) / 0x18)) {
    output = Error::defaultOutput();
    Error::Error(&err,output,(Flags)0x0);
    Debug::operator<<(&err.super_Debug,
                      "Utility::Json::parseUnsignedIntArray(): token not owned by the instance");
    Error::~Error(&err);
    abort();
  }
  uVar2 = token->_sizeFlagsParsedTypeType;
  if ((uint)(uVar2 >> 0x3d) == 2) {
    if ((uVar2 & 0x1c00000000000000) == 0) {
      token->_sizeFlagsParsedTypeType = uVar2 | 0x1c00000000000000;
    }
    value = (token->field_2)._childCount;
    for (; lVar6 + value * -0x18 != 0x18; lVar6 = lVar6 + 0x18) {
      if ((*(ulong *)((long)&token->_sizeFlagsParsedTypeType + lVar6) & 0xe000000000000000) !=
          0xa000000000000000) {
        Error::Error(&err,(Flags)0x0);
        pDVar5 = Debug::operator<<(&err.super_Debug,
                                   "Utility::Json::parseUnsignedIntArray(): expected a number, got")
        ;
        pDVar5 = Utility::operator<<(pDVar5,*(Type *)((long)&token->_sizeFlagsParsedTypeType + lVar6
                                                     ) & (String|Object));
        Debug::operator<<(pDVar5,"at");
        pSVar4 = Containers::Pointer<Corrade::Utility::Json::State>::operator->(&this->_state);
        BVar7 = Containers::BasicStringView<const_char>::prefix<const_char_*,_0>
                          (&pSVar4->string,*(char **)((long)&token->_data + lVar6));
        printFilePosition(this,&err.super_Debug,BVar7);
        goto LAB_00132dbc;
      }
      bVar3 = parseUnsignedIntInternal
                        (this,"Utility::Json::parseUnsignedIntArray():",
                         (JsonToken *)((long)&token->_data + lVar6));
      if (!bVar3) {
        __return_storage_ptr__->_set = false;
        return __return_storage_ptr__;
      }
    }
    if (value == expectedSize || expectedSize == 0) {
      __return_storage_ptr__->_set = true;
      (__return_storage_ptr__->field_0)._value._data = &token[1].field_2;
      *(unsigned_long *)((long)&__return_storage_ptr__->field_0 + 8) = value;
      (__return_storage_ptr__->field_0)._value._stride._data[0] = 0x18;
      return __return_storage_ptr__;
    }
    Error::Error(&err,(Flags)0x0);
    pDVar5 = Debug::operator<<(&err.super_Debug,"Utility::Json::parseUnsignedIntArray(): expected a"
                              );
    pDVar5 = Debug::operator<<(pDVar5,expectedSize);
    (pDVar5->_immediateFlags)._value = (pDVar5->_immediateFlags)._value | 4;
    pDVar5 = Debug::operator<<(pDVar5,"-element array, got");
    pDVar5 = Debug::operator<<(pDVar5,value);
    Debug::operator<<(pDVar5,"at");
    pSVar4 = Containers::Pointer<Corrade::Utility::Json::State>::operator->(&this->_state);
    BVar7 = Containers::BasicStringView<const_char>::prefix<const_char_*,_0>
                      (&pSVar4->string,token->_data);
    printFilePosition(this,&err.super_Debug,BVar7);
  }
  else {
    Error::Error(&err,(Flags)0x0);
    pDVar5 = Debug::operator<<(&err.super_Debug,
                               "Utility::Json::parseUnsignedIntArray(): expected an array, got");
    pDVar5 = Utility::operator<<(pDVar5,token->_sizeFlagsParsedTypeType & (String|Object));
    Debug::operator<<(pDVar5,"at");
    pSVar4 = Containers::Pointer<Corrade::Utility::Json::State>::operator->(&this->_state);
    BVar7 = Containers::BasicStringView<const_char>::prefix<const_char_*,_0>
                      (&pSVar4->string,token->_data);
    printFilePosition(this,&err.super_Debug,BVar7);
  }
LAB_00132dbc:
  __return_storage_ptr__->_set = false;
  Error::~Error(&err);
  return __return_storage_ptr__;
}

Assistant:

Containers::Optional<Containers::StridedArrayView1D<const std::uint32_t>> Json::parseUnsignedIntArray(const JsonToken& token, const std::size_t expectedSize) {
    CORRADE_ASSERT(std::size_t(&token - _state->tokens) < _state->tokens.size(),
        "Utility::Json::parseUnsignedIntArray(): token not owned by the instance", {});

    if(token.type() != JsonToken::Type::Array) {
        Error err;
        err << "Utility::Json::parseUnsignedIntArray(): expected an array, got" << token.type() << "at";
        printFilePosition(err, _state->string.prefix(token._data));
        return {};
    }

    parseObjectArrayInternal(const_cast<JsonToken&>(token));
    const std::size_t size =
        #ifndef CORRADE_TARGET_32BIT
        token._childCount
        #else
        token._childCountFlagsTypeNan & JsonToken::ChildCountMask
        #endif
        ;
    /* As this is expected to be a value array, we go by simple incrementing
       instead of with i->next(). If a nested object or array would be
       encountered, the type() check fails. */
    for(const JsonToken *i = &token + 1, *end = &token + 1 + size; i != end; ++i) {
        if(i->type() != JsonToken::Type::Number) {
            Error err;
            err << "Utility::Json::parseUnsignedIntArray(): expected a number, got" << i->type() << "at";
            printFilePosition(err, _state->string.prefix(i->_data));
            return {};
        }

        if(!parseUnsignedIntInternal("Utility::Json::parseUnsignedIntArray():", const_cast<JsonToken&>(*i)))
            return {};
    }

    /* Needs to be after the type-checking loop, otherwise the child count may
       include also nested tokens and the message would be confusing */
    if(expectedSize && size != expectedSize) {
        Error err;
        err << "Utility::Json::parseUnsignedIntArray(): expected a" << expectedSize << Debug::nospace << "-element array, got" << size << "at";
        printFilePosition(err, _state->string.prefix(token._data));
        return {};
    }

    return Containers::stridedArrayView(&token + 1, size).slice(&JsonToken::_parsedUnsignedInt);
}